

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3rbu * openRbuHandle(char *zTarget,char *zRbu,char *zState)

{
  sqlite3 *db_00;
  int iVar1;
  char *pcVar2;
  long local_80;
  size_t local_78;
  int frc;
  sqlite3 *db;
  rbu_file *pFd;
  long lStack_50;
  int bRetry;
  char *pCsr;
  RbuState *pState;
  size_t nByte;
  size_t nRbu;
  size_t nTarget;
  sqlite3rbu *p;
  char *zState_local;
  char *zRbu_local;
  char *zTarget_local;
  
  p = (sqlite3rbu *)zState;
  zState_local = zRbu;
  zRbu_local = zTarget;
  if (zTarget == (char *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = strlen(zTarget);
  }
  nRbu = local_78;
  nByte = strlen(zState_local);
  pState = (RbuState *)(nRbu + nByte + 0x172);
  nTarget = (size_t)sqlite3_malloc64((sqlite3_uint64)pState);
  if ((void *)nTarget != (void *)0x0) {
    pCsr = (char *)0x0;
    memset((void *)nTarget,0,0x170);
    rbuCreateVfs((sqlite3rbu *)nTarget);
    if (*(int *)(nTarget + 0x38) == 0) {
      lStack_50 = nTarget + 0x170;
      pFd._4_4_ = 0;
      if (zRbu_local != (char *)0x0) {
        *(long *)(nTarget + 0x18) = lStack_50;
        memcpy(*(void **)(nTarget + 0x18),zRbu_local,nRbu + 1);
        lStack_50 = nRbu + 1 + lStack_50;
      }
      *(long *)(nTarget + 0x20) = lStack_50;
      memcpy(*(void **)(nTarget + 0x20),zState_local,nByte + 1);
      lStack_50 = nByte + 1 + lStack_50;
      if (p != (sqlite3rbu *)0x0) {
        pcVar2 = rbuMPrintf((sqlite3rbu *)nTarget,"%s",p);
        *(char **)(nTarget + 0x28) = pcVar2;
      }
      rbuOpenDatabase((sqlite3rbu *)nTarget,(int *)((long)&pFd + 4));
      if (pFd._4_4_ != 0) {
        rbuOpenDatabase((sqlite3rbu *)nTarget,(int *)0x0);
      }
    }
    if ((*(int *)(nTarget + 0x38) == 0) &&
       (pCsr = (char *)rbuLoadState((sqlite3rbu *)nTarget), *(int *)(nTarget + 0x38) == 0)) {
      if (((RbuState *)pCsr)->eStage == 0) {
        rbuDeleteOalFile((sqlite3rbu *)nTarget);
        rbuInitPhaseOneSteps((sqlite3rbu *)nTarget);
        *(undefined4 *)nTarget = 1;
      }
      else {
        *(int *)nTarget = ((RbuState *)pCsr)->eStage;
        *(i64 *)(nTarget + 0x118) = ((RbuState *)pCsr)->nPhaseOneStep;
      }
      *(int *)(nTarget + 0x4c) = (int)*(undefined8 *)(pCsr + 0x30);
      *(undefined8 *)(nTarget + 0x110) = *(undefined8 *)(pCsr + 0x40);
    }
    if ((*(int *)(nTarget + 0x38) == 0) && (*(long *)(*(long *)(nTarget + 0x100) + 0x50) != 0)) {
      if (*(int *)nTarget == 1) {
        *(undefined4 *)(nTarget + 0x38) = 1;
        pcVar2 = sqlite3_mprintf("cannot update wal mode database");
        *(char **)(nTarget + 0x40) = pcVar2;
      }
      else if (*(int *)nTarget == 2) {
        *(undefined4 *)nTarget = 4;
        *(undefined4 *)(nTarget + 0x48) = 0;
      }
    }
    if ((*(int *)(nTarget + 0x38) == 0) &&
       (((*(int *)nTarget == 1 || (*(int *)nTarget == 2)) && (*(int *)pCsr != 0)))) {
      if (*(long *)(nTarget + 0x18) == 0) {
        local_80 = *(long *)(nTarget + 0x168);
      }
      else {
        local_80 = *(long *)(nTarget + 0x100);
      }
      if (*(int *)(local_80 + 0x2c) != *(int *)(pCsr + 0x38)) {
        *(undefined4 *)(nTarget + 0x38) = 5;
        pcVar2 = "update";
        if (*(long *)(nTarget + 0x18) == 0) {
          pcVar2 = "vacuum";
        }
        pcVar2 = sqlite3_mprintf("database modified during rbu %s",pcVar2);
        *(char **)(nTarget + 0x40) = pcVar2;
      }
    }
    if (*(int *)(nTarget + 0x38) == 0) {
      if (*(int *)nTarget == 1) {
        db_00 = *(sqlite3 **)(nTarget + 8);
        iVar1 = sqlite3_exec(*(sqlite3 **)(nTarget + 0x10),"BEGIN",(sqlite3_callback)0x0,(void *)0x0
                             ,(char **)(nTarget + 0x40));
        *(int *)(nTarget + 0x38) = iVar1;
        if (*(int *)(nTarget + 0x38) == 0) {
          iVar1 = rbuObjIterFirst((sqlite3rbu *)nTarget,(RbuObjIter *)(nTarget + 0x50));
          *(int *)(nTarget + 0x38) = iVar1;
        }
        if ((*(int *)(nTarget + 0x38) == 0) && (*(long *)(nTarget + 0xa0) == 0)) {
          *(undefined4 *)(nTarget + 0x38) = 0x65;
          *(undefined4 *)nTarget = 5;
        }
        else {
          if ((*(int *)(nTarget + 0x38) == 0) &&
             ((*(int *)pCsr == 0 && (*(long *)(nTarget + 0x18) == 0)))) {
            rbuCopyPragma((sqlite3rbu *)nTarget,"page_size");
            rbuCopyPragma((sqlite3rbu *)nTarget,"auto_vacuum");
          }
          if (*(int *)(nTarget + 0x38) == 0) {
            iVar1 = sqlite3_exec(db_00,"BEGIN IMMEDIATE",(sqlite3_callback)0x0,(void *)0x0,
                                 (char **)(nTarget + 0x40));
            *(int *)(nTarget + 0x38) = iVar1;
          }
          if ((*(int *)(nTarget + 0x38) == 0) &&
             (iVar1 = sqlite3_file_control(db_00,"main",0x19,(void *)0x0), iVar1 == 0)) {
            iVar1 = sqlite3_exec(db_00,"PRAGMA journal_mode=off",(sqlite3_callback)0x0,(void *)0x0,
                                 (char **)(nTarget + 0x40));
            *(int *)(nTarget + 0x38) = iVar1;
          }
          if (*(int *)(nTarget + 0x38) == 0) {
            rbuSetupOal((sqlite3rbu *)nTarget,(RbuState *)pCsr);
          }
        }
      }
      else if (*(int *)nTarget != 2) {
        if (*(int *)nTarget == 4) {
          rbuSetupCheckpoint((sqlite3rbu *)nTarget,(RbuState *)pCsr);
        }
        else if (*(int *)nTarget == 5) {
          *(undefined4 *)(nTarget + 0x38) = 0x65;
        }
        else {
          *(undefined4 *)(nTarget + 0x38) = 0xb;
        }
      }
    }
    rbuFreeState((RbuState *)pCsr);
  }
  return (sqlite3rbu *)nTarget;
}

Assistant:

static sqlite3rbu *openRbuHandle(
  const char *zTarget, 
  const char *zRbu,
  const char *zState
){
  sqlite3rbu *p;
  size_t nTarget = zTarget ? strlen(zTarget) : 0;
  size_t nRbu = strlen(zRbu);
  size_t nByte = sizeof(sqlite3rbu) + nTarget+1 + nRbu+1;

  p = (sqlite3rbu*)sqlite3_malloc64(nByte);
  if( p ){
    RbuState *pState = 0;

    /* Create the custom VFS. */
    memset(p, 0, sizeof(sqlite3rbu));
    rbuCreateVfs(p);

    /* Open the target, RBU and state databases */
    if( p->rc==SQLITE_OK ){
      char *pCsr = (char*)&p[1];
      int bRetry = 0;
      if( zTarget ){
        p->zTarget = pCsr;
        memcpy(p->zTarget, zTarget, nTarget+1);
        pCsr += nTarget+1;
      }
      p->zRbu = pCsr;
      memcpy(p->zRbu, zRbu, nRbu+1);
      pCsr += nRbu+1;
      if( zState ){
        p->zState = rbuMPrintf(p, "%s", zState);
      }

      /* If the first attempt to open the database file fails and the bRetry
      ** flag it set, this means that the db was not opened because it seemed
      ** to be a wal-mode db. But, this may have happened due to an earlier
      ** RBU vacuum operation leaving an old wal file in the directory.
      ** If this is the case, it will have been checkpointed and deleted
      ** when the handle was closed and a second attempt to open the 
      ** database may succeed.  */
      rbuOpenDatabase(p, &bRetry);
      if( bRetry ){
        rbuOpenDatabase(p, 0);
      }
    }

    if( p->rc==SQLITE_OK ){
      pState = rbuLoadState(p);
      assert( pState || p->rc!=SQLITE_OK );
      if( p->rc==SQLITE_OK ){

        if( pState->eStage==0 ){ 
          rbuDeleteOalFile(p);
          rbuInitPhaseOneSteps(p);
          p->eStage = RBU_STAGE_OAL;
        }else{
          p->eStage = pState->eStage;
          p->nPhaseOneStep = pState->nPhaseOneStep;
        }
        p->nProgress = pState->nProgress;
        p->iOalSz = pState->iOalSz;
      }
    }
    assert( p->rc!=SQLITE_OK || p->eStage!=0 );

    if( p->rc==SQLITE_OK && p->pTargetFd->pWalFd ){
      if( p->eStage==RBU_STAGE_OAL ){
        p->rc = SQLITE_ERROR;
        p->zErrmsg = sqlite3_mprintf("cannot update wal mode database");
      }else if( p->eStage==RBU_STAGE_MOVE ){
        p->eStage = RBU_STAGE_CKPT;
        p->nStep = 0;
      }
    }

    if( p->rc==SQLITE_OK 
     && (p->eStage==RBU_STAGE_OAL || p->eStage==RBU_STAGE_MOVE)
     && pState->eStage!=0
    ){
      rbu_file *pFd = (rbuIsVacuum(p) ? p->pRbuFd : p->pTargetFd);
      if( pFd->iCookie!=pState->iCookie ){   
        /* At this point (pTargetFd->iCookie) contains the value of the
        ** change-counter cookie (the thing that gets incremented when a 
        ** transaction is committed in rollback mode) currently stored on 
        ** page 1 of the database file. */
        p->rc = SQLITE_BUSY;
        p->zErrmsg = sqlite3_mprintf("database modified during rbu %s",
            (rbuIsVacuum(p) ? "vacuum" : "update")
        );
      }
    }

    if( p->rc==SQLITE_OK ){
      if( p->eStage==RBU_STAGE_OAL ){
        sqlite3 *db = p->dbMain;
        p->rc = sqlite3_exec(p->dbRbu, "BEGIN", 0, 0, &p->zErrmsg);

        /* Point the object iterator at the first object */
        if( p->rc==SQLITE_OK ){
          p->rc = rbuObjIterFirst(p, &p->objiter);
        }

        /* If the RBU database contains no data_xxx tables, declare the RBU
        ** update finished.  */
        if( p->rc==SQLITE_OK && p->objiter.zTbl==0 ){
          p->rc = SQLITE_DONE;
          p->eStage = RBU_STAGE_DONE;
        }else{
          if( p->rc==SQLITE_OK && pState->eStage==0 && rbuIsVacuum(p) ){
            rbuCopyPragma(p, "page_size");
            rbuCopyPragma(p, "auto_vacuum");
          }

          /* Open transactions both databases. The *-oal file is opened or
          ** created at this point. */
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(db, "BEGIN IMMEDIATE", 0, 0, &p->zErrmsg);
          }

          /* Check if the main database is a zipvfs db. If it is, set the upper
          ** level pager to use "journal_mode=off". This prevents it from 
          ** generating a large journal using a temp file.  */
          if( p->rc==SQLITE_OK ){
            int frc = sqlite3_file_control(db, "main", SQLITE_FCNTL_ZIPVFS, 0);
            if( frc==SQLITE_OK ){
              p->rc = sqlite3_exec(
                db, "PRAGMA journal_mode=off",0,0,&p->zErrmsg);
            }
          }

          if( p->rc==SQLITE_OK ){
            rbuSetupOal(p, pState);
          }
        }
      }else if( p->eStage==RBU_STAGE_MOVE ){
        /* no-op */
      }else if( p->eStage==RBU_STAGE_CKPT ){
        rbuSetupCheckpoint(p, pState);
      }else if( p->eStage==RBU_STAGE_DONE ){
        p->rc = SQLITE_DONE;
      }else{
        p->rc = SQLITE_CORRUPT;
      }
    }

    rbuFreeState(pState);
  }

  return p;
}